

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O0

int transcode(int K,int symSize,string *inputFname,string *outputFname,string *inputEsiStr,
             string *outputEsiStr)

{
  undefined4 uVar1;
  FILE *__stream;
  string *psVar2;
  uint uVar3;
  size_t __size;
  size_t sVar4;
  _Ios_Openmode _Var5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  undefined8 uVar7;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  undefined1 *puVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined8 uStackY_690;
  undefined1 auStackY_688 [7];
  byte local_681;
  uint local_680;
  uint local_67c;
  long local_678;
  long local_670;
  FILE *local_668;
  undefined8 local_660;
  byte local_651;
  uint local_650;
  uint local_64c;
  uint local_648;
  uint local_644;
  ulong local_640;
  undefined1 *local_638;
  long local_630;
  uint local_628;
  uint local_624;
  uint local_620;
  uint local_61c;
  ulong local_618;
  undefined1 *local_610;
  long local_608;
  uint local_600;
  byte local_5fa;
  byte local_5f9;
  streamoff local_5f8;
  string *local_5f0;
  string *local_5e8;
  string *local_5e0;
  string *local_5d8;
  undefined1 *local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  uint local_5b8;
  uint local_5b4;
  int RUN_NOFAIL__err_8;
  int RUN_NOFAIL__err_7;
  unsigned_long __vla_expr4;
  int local_59c;
  int local_598;
  int i_2;
  int count;
  int RUN_NOFAIL__err_6;
  int RUN_NOFAIL__err_5;
  int i_1;
  int RUN_NOFAIL__err_4;
  int RUN_NOFAIL__err_3;
  size_t outProgSize;
  size_t outWorkSize;
  unsigned_long __vla_expr3;
  ulong local_548;
  unsigned_long __vla_expr2;
  uint local_520;
  uint local_51c;
  int outputEsiCnt;
  int RUN_NOFAIL__err_2;
  int i;
  int RUN_NOFAIL__err_1;
  int RUN_NOFAIL__err;
  int nExtra;
  size_t iblockSymCnt;
  size_t interProgSize;
  size_t interWorkSize;
  ulong local_4d0;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  string local_4b8 [4];
  int iStack_4b4;
  undefined8 auStack_4b0 [3];
  uint local_498;
  int local_494;
  int inputEsiCnt;
  ofstream ofs;
  undefined8 local_280;
  undefined8 local_278;
  int local_26c;
  long lStack_268;
  int length;
  ifstream ifs;
  RqOutProgram *outProgram;
  RqOutWorkMem *outWork;
  RqInterProgram *interProgram;
  RqInterWorkMem *interWork;
  int status;
  string *outputEsiStr_local;
  string *inputEsiStr_local;
  string *outputFname_local;
  string *inputFname_local;
  int symSize_local;
  int K_local;
  
  interWork._4_4_ = 0;
  uStackY_690 = 0x103b93;
  local_5f0 = outputFname;
  local_5e8 = inputEsiStr;
  local_5e0 = outputEsiStr;
  local_5d8 = inputFname;
  _Var5 = std::operator|(_S_bin,_S_ate);
  local_5d0 = (undefined1 *)&stack0xfffffffffffffd98;
  uStackY_690 = 0x103baf;
  std::ifstream::ifstream(local_5d0,(string *)local_5d8,_Var5);
  uStackY_690 = 0x103bbb;
  auVar13 = std::istream::tellg();
  local_5c8 = auVar13._8_8_;
  local_5c0 = auVar13._0_8_;
  uStackY_690 = 0x103bf3;
  local_280 = local_5c0;
  local_278 = local_5c8;
  local_5f8 = std::fpos::operator_cast_to_long((fpos *)&local_280);
  local_26c = (int)local_5f8;
  uStackY_690 = 0x103c19;
  std::istream::seekg((long)&stack0xfffffffffffffd98,_S_beg);
  uStackY_690 = 0x103c33;
  std::ofstream::ofstream(&inputEsiCnt,(string *)local_5f0,_S_bin);
  uStackY_690 = 0x103c4d;
  local_5f9 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffd98 +
                                         *(long *)(lStack_268 + -0x18)));
  if ((local_5f9 & 1) == 0) {
    uStackY_690 = 0x103d65;
    local_5fa = std::ios::operator!((ios *)((long)&inputEsiCnt + *(long *)(_inputEsiCnt + -0x18)));
    if ((local_5fa & 1) == 0) {
      uStackY_690 = 0x103e48;
      std::__cxx11::string::string(local_4b8,(string *)local_5e8);
      uStackY_690 = 0x103e56;
      local_600 = getESICnt((string *)__vla_expr0);
      uStackY_690 = 0x103e6a;
      std::__cxx11::string::~string(local_4b8);
      psVar2 = local_5e8;
      local_498 = local_600;
      local_618 = (ulong)(local_600 * symSize);
      local_610 = auStackY_688 + -(local_618 + 0xf & 0xfffffffffffffff0);
      local_4d0 = (ulong)local_600;
      lVar8 = (long)local_610 - (local_4d0 * 4 + 0xf & 0xfffffffffffffff0);
      local_608 = lVar8;
      __vla_expr1 = local_618;
      __vla_expr0 = (unsigned_long)auStackY_688;
      *(undefined8 *)(lVar8 + -8) = 0x103ef1;
      std::__cxx11::string::string((string *)&interWorkSize,(string *)psVar2);
      *(undefined8 *)(lVar8 + -8) = 0x103f0c;
      parseESIStr(*(string **)(lVar8 + 0x1d8),*(int *)(lVar8 + 0x1d4),*(uint32_t **)(lVar8 + 0x1c8))
      ;
      *(undefined8 *)(lVar8 + -8) = 0x103f1a;
      std::__cxx11::string::~string((string *)&interWorkSize);
      iVar6 = local_498 - K;
      RUN_NOFAIL__err_1 = iVar6;
      *(undefined8 *)(lVar8 + -8) = 0x103f4c;
      local_61c = RqInterGetMemSizes(K,iVar6,&interProgSize,&iblockSymCnt,&RUN_NOFAIL__err);
      sVar4 = interProgSize;
      i = local_61c;
      if (local_61c == 0) {
        *(undefined8 *)(lVar8 + -8) = 0x10408a;
        __ptr = malloc(sVar4);
        iVar6 = RUN_NOFAIL__err_1;
        *(undefined8 *)(lVar8 + -8) = 0x1040a7;
        local_620 = RqInterInit(K,iVar6,__ptr,interProgSize);
        RUN_NOFAIL__err_2 = local_620;
        if (local_620 == 0) {
          for (outputEsiCnt = 0; sVar4 = iblockSymCnt, outputEsiCnt < (int)local_498;
              outputEsiCnt = outputEsiCnt + 1) {
            uVar1 = *(undefined4 *)(local_608 + (long)outputEsiCnt * 4);
            *(undefined8 *)(lVar8 + -8) = 0x1041c8;
            RqInterAddIds(__ptr,uVar1,1);
          }
          *(undefined8 *)(lVar8 + -8) = 0x1041e9;
          __ptr_00 = malloc(sVar4);
          *(undefined8 *)(lVar8 + -8) = 0x104201;
          local_624 = RqInterCompile(__ptr,__ptr_00,iblockSymCnt);
          psVar2 = local_5e0;
          local_51c = local_624;
          if (local_624 == 0) {
            *(undefined8 *)(lVar8 + -8) = 0x1042fe;
            std::__cxx11::string::string((string *)&__vla_expr2,(string *)psVar2);
            *(undefined8 *)(lVar8 + -8) = 0x10430c;
            local_628 = getESICnt(*(string **)(lVar8 + 0x1c8));
            *(undefined8 *)(lVar8 + -8) = 0x104320;
            std::__cxx11::string::~string((string *)&__vla_expr2);
            psVar2 = local_5e0;
            local_520 = local_628;
            local_548 = (ulong)local_628;
            lVar8 = lVar8 - (local_548 * 4 + 0xf & 0xfffffffffffffff0);
            local_630 = lVar8;
            *(undefined8 *)(lVar8 + -8) = 0x104368;
            std::__cxx11::string::string((string *)&__vla_expr3,(string *)psVar2);
            *(undefined8 *)(lVar8 + -8) = 0x104383;
            parseESIStr(*(string **)(lVar8 + 0x1d8),*(int *)(lVar8 + 0x1d4),
                        *(uint32_t **)(lVar8 + 0x1c8));
            *(undefined8 *)(lVar8 + -8) = 0x104391;
            std::__cxx11::string::~string((string *)&__vla_expr3);
            uVar3 = local_520;
            local_640 = (ulong)(local_520 * symSize);
            puVar9 = (undefined1 *)(lVar8 - (local_640 + 0xf & 0xfffffffffffffff0));
            local_638 = puVar9;
            outWorkSize = local_640;
            *(undefined8 *)(puVar9 + -8) = 0x1043df;
            local_644 = RqOutGetMemSizes(uVar3,&outProgSize,&RUN_NOFAIL__err_4);
            sVar4 = outProgSize;
            i_1 = local_644;
            if (local_644 == 0) {
              *(undefined8 *)(puVar9 + -8) = 0x10451d;
              __ptr_01 = malloc(sVar4);
              __size = _RUN_NOFAIL__err_4;
              *(undefined8 *)(puVar9 + -8) = 0x10452d;
              __ptr_02 = malloc(__size);
              *(undefined8 *)(puVar9 + -8) = 0x104544;
              local_648 = RqOutInit(K,__ptr_01,outProgSize);
              RUN_NOFAIL__err_5 = local_648;
              if (local_648 == 0) {
                for (RUN_NOFAIL__err_6 = 0; RUN_NOFAIL__err_6 < (int)local_520;
                    RUN_NOFAIL__err_6 = RUN_NOFAIL__err_6 + 1) {
                  uVar1 = *(undefined4 *)(local_630 + (long)RUN_NOFAIL__err_6 * 4);
                  *(undefined8 *)(puVar9 + -8) = 0x10466b;
                  local_64c = RqOutAddIds(__ptr_01,uVar1,1);
                  count = local_64c;
                  if (local_64c != 0) {
                    uVar12 = (ulong)local_64c;
                    *(undefined8 *)(puVar9 + -8) = 0x1046ba;
                    fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                            ,0xdf,"RqOutAddIds(outWork, ESIs_wanted[i], 1)",uVar12);
                    iVar6 = count;
                    if (__ptr_00 != (void *)0x0) {
                      *(undefined8 *)(puVar9 + -8) = 0x1046d3;
                      free(__ptr_00);
                    }
                    if (__ptr != (void *)0x0) {
                      *(undefined8 *)(puVar9 + -8) = 0x1046e3;
                      free(__ptr);
                    }
                    if (__ptr_01 != (void *)0x0) {
                      *(undefined8 *)(puVar9 + -8) = 0x1046f3;
                      free(__ptr_01);
                    }
                    if (__ptr_02 != (void *)0x0) {
                      *(undefined8 *)(puVar9 + -8) = 0x104703;
                      free(__ptr_02);
                    }
                    *(undefined8 *)(puVar9 + -8) = 0x10470f;
                    std::ifstream::close();
                    *(undefined8 *)(puVar9 + -8) = 0x10471d;
                    std::ofstream::close();
                    puVar11 = (undefined1 *)__vla_expr0;
                    if (iVar6 == 0) {
                      symSize_local = 1;
                      local_494 = 1;
                    }
                    else {
                      symSize_local = 0;
                      local_494 = 1;
                    }
                    goto LAB_00104e48;
                  }
                }
                *(undefined8 *)(puVar9 + -8) = 0x104781;
                local_650 = RqOutCompile(__ptr_01,__ptr_02,_RUN_NOFAIL__err_4);
                i_2 = local_650;
                if (local_650 == 0) {
                  local_598 = 0;
                  do {
                    puVar11 = local_610;
                    if (local_26c <= local_598) {
                      if (__ptr_00 != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x104dc8;
                        free(__ptr_00);
                      }
                      if (__ptr != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x104dd8;
                        free(__ptr);
                      }
                      if (__ptr_01 != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x104de8;
                        free(__ptr_01);
                      }
                      if (__ptr_02 != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x104df8;
                        free(__ptr_02);
                      }
                      *(undefined8 *)(puVar9 + -8) = 0x104e04;
                      std::ifstream::close();
                      *(undefined8 *)(puVar9 + -8) = 0x104e12;
                      std::ofstream::close();
                      puVar11 = (undefined1 *)__vla_expr0;
                      if (interWork._4_4_ == 0) {
                        symSize_local = 1;
                        local_494 = 1;
                      }
                      else {
                        symSize_local = 0;
                        local_494 = 1;
                      }
                      break;
                    }
                    for (local_59c = 0; local_59c < (int)(local_498 * symSize);
                        local_59c = local_59c + 1) {
                      local_610[local_59c] = 0;
                    }
                    *(undefined8 *)(puVar9 + -8) = 0x1048ea;
                    std::istream::read((char *)&stack0xfffffffffffffd98,(long)puVar11);
                    lVar8 = *(long *)(lStack_268 + -0x18);
                    *(undefined8 *)(puVar9 + -8) = 0x104904;
                    local_651 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffd98 + lVar8))
                    ;
                    puVar11 = local_610;
                    uVar12 = local_618;
                    if ((local_651 & 1) != 0) {
                      local_668 = _stderr;
                      *(undefined8 *)(puVar9 + -8) = 0x104938;
                      uVar7 = std::istream::gcount();
                      __stream = local_668;
                      local_660 = uVar7;
                      *(undefined8 *)(puVar9 + -8) = 0x104969;
                      fprintf(__stream,"Error: %s:%d: Unable to read enough bytes from file: %ld\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                              ,0xec,uVar7);
                      if (__ptr_00 != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x104980;
                        free(__ptr_00);
                      }
                      if (__ptr != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x104990;
                        free(__ptr);
                      }
                      if (__ptr_01 != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x1049a0;
                        free(__ptr_01);
                      }
                      if (__ptr_02 != (void *)0x0) {
                        *(undefined8 *)(puVar9 + -8) = 0x1049b0;
                        free(__ptr_02);
                      }
                      *(undefined8 *)(puVar9 + -8) = 0x1049bc;
                      std::ifstream::close();
                      *(undefined8 *)(puVar9 + -8) = 0x1049ca;
                      std::ofstream::close();
                      symSize_local = 0;
                      local_494 = 1;
                      puVar11 = (undefined1 *)__vla_expr0;
                      break;
                    }
                    local_598 = local_598 + local_498 * symSize;
                    lVar8 = _RUN_NOFAIL__err * symSize;
                    lVar10 = (long)puVar9 - (lVar8 + 0xfU & 0xfffffffffffffff0);
                    local_678 = lVar8;
                    local_670 = lVar10;
                    _RUN_NOFAIL__err_8 = lVar8;
                    __vla_expr4 = (unsigned_long)puVar9;
                    *(undefined8 *)(lVar10 + -8) = 0x104a83;
                    local_67c = RqInterExecute(__ptr_00,(long)symSize,puVar11,uVar12,lVar10,lVar8);
                    puVar11 = local_638;
                    uVar12 = local_640;
                    local_5b4 = local_67c;
                    if (local_67c == 0) {
                      *(undefined8 *)(lVar10 + -8) = 0x104b82;
                      memset(puVar11,0,uVar12);
                      puVar11 = local_638;
                      uVar12 = local_640;
                      lVar8 = local_670;
                      *(undefined8 *)(lVar10 + -8) = 0x104ba4;
                      local_680 = RqOutExecute(__ptr_02,(long)symSize,lVar8,puVar11,uVar12);
                      puVar11 = local_638;
                      local_5b8 = local_680;
                      if (local_680 == 0) {
                        *(undefined8 *)(lVar10 + -8) = 0x104ca8;
                        std::ostream::write((char *)&inputEsiCnt,(long)puVar11);
                        *(undefined8 *)(lVar10 + -8) = 0x104cc2;
                        local_681 = std::ios::good();
                        if ((local_681 & 1) == 0) {
                          *(undefined8 *)(lVar10 + -8) = 0x104cfe;
                          fprintf(_stderr,"Error:%s:%d: Error while writing to output file\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                  ,0x10b);
                          interWork._4_4_ = 1;
                          if (__ptr_00 != (void *)0x0) {
                            *(undefined8 *)(lVar10 + -8) = 0x104d15;
                            free(__ptr_00);
                          }
                          if (__ptr != (void *)0x0) {
                            *(undefined8 *)(lVar10 + -8) = 0x104d25;
                            free(__ptr);
                          }
                          if (__ptr_01 != (void *)0x0) {
                            *(undefined8 *)(lVar10 + -8) = 0x104d35;
                            free(__ptr_01);
                          }
                          if (__ptr_02 != (void *)0x0) {
                            *(undefined8 *)(lVar10 + -8) = 0x104d45;
                            free(__ptr_02);
                          }
                          *(undefined8 *)(lVar10 + -8) = 0x104d51;
                          std::ifstream::close();
                          *(undefined8 *)(lVar10 + -8) = 0x104d5f;
                          std::ofstream::close();
                          symSize_local = 0;
                          local_494 = 1;
                        }
                        else {
                          local_494 = 0;
                        }
                      }
                      else {
                        uVar12 = (ulong)local_680;
                        *(undefined8 *)(lVar10 + -8) = 0x104bf3;
                        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                ,0x103,"RqOutExecute(outProgram, symSize, iblock, enc, sizeof(enc))"
                                ,uVar12);
                        uVar3 = local_5b8;
                        interWork._4_4_ = local_5b8;
                        if (__ptr_00 != (void *)0x0) {
                          *(undefined8 *)(lVar10 + -8) = 0x104c0c;
                          free(__ptr_00);
                        }
                        if (__ptr != (void *)0x0) {
                          *(undefined8 *)(lVar10 + -8) = 0x104c1c;
                          free(__ptr);
                        }
                        if (__ptr_01 != (void *)0x0) {
                          *(undefined8 *)(lVar10 + -8) = 0x104c2c;
                          free(__ptr_01);
                        }
                        if (__ptr_02 != (void *)0x0) {
                          *(undefined8 *)(lVar10 + -8) = 0x104c3c;
                          free(__ptr_02);
                        }
                        *(undefined8 *)(lVar10 + -8) = 0x104c48;
                        std::ifstream::close();
                        *(undefined8 *)(lVar10 + -8) = 0x104c56;
                        std::ofstream::close();
                        if (uVar3 == 0) {
                          symSize_local = 1;
                          local_494 = 1;
                        }
                        else {
                          symSize_local = 0;
                          local_494 = 1;
                        }
                      }
                    }
                    else {
                      uVar12 = (ulong)local_67c;
                      *(undefined8 *)(lVar10 + -8) = 0x104ad2;
                      fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                              ,0xfb,
                              "RqInterExecute(interProgram, symSize, src, sizeof(src), iblock, sizeof(iblock))"
                              ,uVar12);
                      uVar3 = local_5b4;
                      interWork._4_4_ = local_5b4;
                      if (__ptr_00 != (void *)0x0) {
                        *(undefined8 *)(lVar10 + -8) = 0x104aeb;
                        free(__ptr_00);
                      }
                      if (__ptr != (void *)0x0) {
                        *(undefined8 *)(lVar10 + -8) = 0x104afb;
                        free(__ptr);
                      }
                      if (__ptr_01 != (void *)0x0) {
                        *(undefined8 *)(lVar10 + -8) = 0x104b0b;
                        free(__ptr_01);
                      }
                      if (__ptr_02 != (void *)0x0) {
                        *(undefined8 *)(lVar10 + -8) = 0x104b1b;
                        free(__ptr_02);
                      }
                      *(undefined8 *)(lVar10 + -8) = 0x104b27;
                      std::ifstream::close();
                      *(undefined8 *)(lVar10 + -8) = 0x104b35;
                      std::ofstream::close();
                      if (uVar3 == 0) {
                        symSize_local = 1;
                        local_494 = 1;
                      }
                      else {
                        symSize_local = 0;
                        local_494 = 1;
                      }
                    }
                    puVar9 = (undefined1 *)__vla_expr4;
                    puVar11 = (undefined1 *)__vla_expr0;
                  } while (local_494 == 0);
                }
                else {
                  uVar12 = (ulong)local_650;
                  *(undefined8 *)(puVar9 + -8) = 0x1047d0;
                  fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                          ,0xe0,"RqOutCompile(outWork, outProgram, outProgSize)",uVar12);
                  iVar6 = i_2;
                  if (__ptr_00 != (void *)0x0) {
                    *(undefined8 *)(puVar9 + -8) = 0x1047e9;
                    free(__ptr_00);
                  }
                  if (__ptr != (void *)0x0) {
                    *(undefined8 *)(puVar9 + -8) = 0x1047f9;
                    free(__ptr);
                  }
                  if (__ptr_01 != (void *)0x0) {
                    *(undefined8 *)(puVar9 + -8) = 0x104809;
                    free(__ptr_01);
                  }
                  if (__ptr_02 != (void *)0x0) {
                    *(undefined8 *)(puVar9 + -8) = 0x104819;
                    free(__ptr_02);
                  }
                  *(undefined8 *)(puVar9 + -8) = 0x104825;
                  std::ifstream::close();
                  *(undefined8 *)(puVar9 + -8) = 0x104833;
                  std::ofstream::close();
                  puVar11 = (undefined1 *)__vla_expr0;
                  if (iVar6 == 0) {
                    symSize_local = 1;
                    local_494 = 1;
                  }
                  else {
                    symSize_local = 0;
                    local_494 = 1;
                  }
                }
              }
              else {
                uVar12 = (ulong)local_648;
                *(undefined8 *)(puVar9 + -8) = 0x104593;
                fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                        ,0xdd,"RqOutInit(K, outWork, outWorkSize)",uVar12);
                iVar6 = RUN_NOFAIL__err_5;
                if (__ptr_00 != (void *)0x0) {
                  *(undefined8 *)(puVar9 + -8) = 0x1045ac;
                  free(__ptr_00);
                }
                if (__ptr != (void *)0x0) {
                  *(undefined8 *)(puVar9 + -8) = 0x1045bc;
                  free(__ptr);
                }
                if (__ptr_01 != (void *)0x0) {
                  *(undefined8 *)(puVar9 + -8) = 0x1045cc;
                  free(__ptr_01);
                }
                if (__ptr_02 != (void *)0x0) {
                  *(undefined8 *)(puVar9 + -8) = 0x1045dc;
                  free(__ptr_02);
                }
                *(undefined8 *)(puVar9 + -8) = 0x1045e8;
                std::ifstream::close();
                *(undefined8 *)(puVar9 + -8) = 0x1045f6;
                std::ofstream::close();
                puVar11 = (undefined1 *)__vla_expr0;
                if (iVar6 == 0) {
                  symSize_local = 1;
                  local_494 = 1;
                }
                else {
                  symSize_local = 0;
                  local_494 = 1;
                }
              }
            }
            else {
              uVar12 = (ulong)local_644;
              *(undefined8 *)(puVar9 + -8) = 0x10442e;
              fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                      ,0xda,"RqOutGetMemSizes(outputEsiCnt, &outWorkSize, &outProgSize)",uVar12);
              iVar6 = i_1;
              if (__ptr_00 != (void *)0x0) {
                *(undefined8 *)(puVar9 + -8) = 0x104447;
                free(__ptr_00);
              }
              if (__ptr != (void *)0x0) {
                *(undefined8 *)(puVar9 + -8) = 0x10449f;
                free(__ptr);
              }
              *(undefined8 *)(puVar9 + -8) = 0x1044cb;
              std::ifstream::close();
              *(undefined8 *)(puVar9 + -8) = 0x1044d9;
              std::ofstream::close();
              puVar11 = (undefined1 *)__vla_expr0;
              if (iVar6 == 0) {
                symSize_local = 1;
                local_494 = 1;
              }
              else {
                symSize_local = 0;
                local_494 = 1;
              }
            }
          }
          else {
            uVar12 = (ulong)local_624;
            *(undefined8 *)(lVar8 + -8) = 0x104250;
            fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                    ,0xcf,"RqInterCompile(interWork, interProgram, interProgSize)",uVar12);
            uVar3 = local_51c;
            if (__ptr_00 != (void *)0x0) {
              *(undefined8 *)(lVar8 + -8) = 0x104269;
              free(__ptr_00);
            }
            if (__ptr != (void *)0x0) {
              *(undefined8 *)(lVar8 + -8) = 0x104279;
              free(__ptr);
            }
            *(undefined8 *)(lVar8 + -8) = 0x1042a5;
            std::ifstream::close();
            *(undefined8 *)(lVar8 + -8) = 0x1042b3;
            std::ofstream::close();
            puVar11 = (undefined1 *)__vla_expr0;
            if (uVar3 == 0) {
              symSize_local = 1;
              local_494 = 1;
            }
            else {
              symSize_local = 0;
              local_494 = 1;
            }
          }
        }
        else {
          uVar12 = (ulong)local_620;
          *(undefined8 *)(lVar8 + -8) = 0x1040f6;
          fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                  ,0xc9,"RqInterInit(K, nExtra, interWork, interWorkSize)",uVar12);
          iVar6 = RUN_NOFAIL__err_2;
          if (__ptr != (void *)0x0) {
            *(undefined8 *)(lVar8 + -8) = 0x10411f;
            free(__ptr);
          }
          *(undefined8 *)(lVar8 + -8) = 0x10414b;
          std::ifstream::close();
          *(undefined8 *)(lVar8 + -8) = 0x104159;
          std::ofstream::close();
          puVar11 = (undefined1 *)__vla_expr0;
          if (iVar6 == 0) {
            symSize_local = 1;
            local_494 = 1;
          }
          else {
            symSize_local = 0;
            local_494 = 1;
          }
        }
      }
      else {
        uVar12 = (ulong)local_61c;
        *(undefined8 *)(lVar8 + -8) = 0x103f9b;
        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                ,0xc5,"RqInterGetMemSizes(K, nExtra, &interWorkSize, &interProgSize, &iblockSymCnt)"
                ,uVar12);
        iVar6 = i;
        *(undefined8 *)(lVar8 + -8) = 0x104038;
        std::ifstream::close();
        *(undefined8 *)(lVar8 + -8) = 0x104046;
        std::ofstream::close();
        puVar11 = (undefined1 *)__vla_expr0;
        if (iVar6 == 0) {
          symSize_local = 1;
          local_494 = 1;
        }
        else {
          symSize_local = 0;
          local_494 = 1;
        }
      }
    }
    else {
      uStackY_690 = 0x103da0;
      fprintf(_stderr,"Error:%s:%d: Unable to open output file\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
              ,0xb0);
      uStackY_690 = 0x103df3;
      std::ifstream::close();
      uStackY_690 = 0x103e01;
      std::ofstream::close();
      symSize_local = 0;
      local_494 = 1;
      puVar11 = auStackY_688;
    }
  }
  else {
    uStackY_690 = 0x103c88;
    fprintf(_stderr,"Error:%s:%d: Unable to open input file\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
            ,0xa8);
    uStackY_690 = 0x103d0b;
    std::ifstream::close();
    uStackY_690 = 0x103d19;
    std::ofstream::close();
    symSize_local = 0;
    local_494 = 1;
    puVar11 = auStackY_688;
  }
LAB_00104e48:
  *(undefined8 *)(puVar11 + -8) = 0x104e54;
  std::ofstream::~ofstream(&inputEsiCnt);
  *(undefined8 *)(puVar11 + -8) = 0x104e60;
  std::ifstream::~ifstream(&stack0xfffffffffffffd98);
  return symSize_local;
}

Assistant:

int transcode(int K, int symSize, string inputFname, string outputFname, string inputEsiStr,
              string outputEsiStr)
{
    int status = 0;

    RqInterWorkMem* interWork = NULL;
    RqInterProgram* interProgram = NULL;
    RqOutWorkMem*   outWork = NULL;
    RqOutProgram*   outProgram = NULL;

    /* Open input and output files */
    ifstream ifs(inputFname, ios::binary|ios::ate);
    int length = ifs.tellg();
    ifs.seekg(0, ios::beg);

    ofstream ofs(outputFname, ios::binary);

#define DONE()                                                  \
    do {                                                        \
        if (interProgram)    free(interProgram);                \
        if (interWork)       free(interWork);                   \
        if (outWork)         free(outWork);                     \
        if (outProgram)      free(outProgram);                  \
        ifs.close();                                            \
        ofs.close();                                            \
        if (status == 0) return true; else return false;        \
    } while(0);
#define RUN_NOFAIL(x)   RUN_NOFAIL__INT(x, RUN_NOFAIL__err)
#define RUN_NOFAIL__INT(x,           err)                       \
    do {                                                        \
        int err;                                                \
        if ((err = (x)) != 0) {                                 \
            fprintf(stderr, "Error:%s:%d:  %s failed: %d\n",    \
                    __FILE__, __LINE__, #x, err);               \
            status = err;                                       \
            DONE();                                             \
        }                                                       \
    } while(0)

    if (!ifs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open input file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    if (!ofs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open output file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    /* Setup src block */
    int inputEsiCnt = getESICnt(inputEsiStr);
    uint8_t src[inputEsiCnt * symSize];

    uint32_t ESIs_input[inputEsiCnt];
    parseESIStr(inputEsiStr, inputEsiCnt, ESIs_input);

    size_t interWorkSize, interProgSize, iblockSymCnt;

    /* Get various memory sizes from RQ API */
    const int nExtra = inputEsiCnt - K;
    RUN_NOFAIL(RqInterGetMemSizes(K,
                                nExtra,
                                &interWorkSize,
                                &interProgSize,
                                &iblockSymCnt));

    /* Create encoding interProgram */
    interWork = (RqInterWorkMem* )malloc(interWorkSize);
    RUN_NOFAIL(RqInterInit(K, nExtra, interWork, interWorkSize));
    for (int i = 0; i < inputEsiCnt; ++i) {
        RqInterAddIds(interWork, ESIs_input[i], 1);
    }

    interProgram = (RqInterProgram*)malloc(interProgSize);
    RUN_NOFAIL(RqInterCompile(interWork, interProgram, interProgSize));

    /* Setup enc block */
    int outputEsiCnt = getESICnt(outputEsiStr);
    uint32_t ESIs_wanted[outputEsiCnt];

    parseESIStr(outputEsiStr, outputEsiCnt, ESIs_wanted);
    uint8_t enc[outputEsiCnt * symSize];

    /* Create encoding output symbol Program */
    size_t outWorkSize, outProgSize;
    RUN_NOFAIL(RqOutGetMemSizes(outputEsiCnt, &outWorkSize, &outProgSize));
    outWork = (RqOutWorkMem*) malloc(outWorkSize);
    outProgram = (RqOutProgram*) malloc(outProgSize);
    RUN_NOFAIL(RqOutInit(K, outWork, outWorkSize));
    for (int i = 0; i < outputEsiCnt; ++i)
        RUN_NOFAIL(RqOutAddIds(outWork, ESIs_wanted[i], 1));
    RUN_NOFAIL(RqOutCompile(outWork, outProgram, outProgSize));

    /* Iterate through the input file and transcode the data */
    int count =  0;
    while (count < length) {
        for (int i = 0; i < inputEsiCnt * symSize; ++i) {
            src[i] = 0x00;
        }

        ifs.read((char*)src, inputEsiCnt * symSize);
        if (!ifs) {
            fprintf(stderr, "Error: %s:%d: Unable to read enough bytes from file: %ld\n",
                    __FILE__, __LINE__, ifs.gcount());

            status = 1;
            DONE();
        }

        count += inputEsiCnt * symSize;

        /* Create intermediate block */
        uint8_t iblock[iblockSymCnt * symSize];
        RUN_NOFAIL(RqInterExecute(interProgram,         // interProgram
				  symSize,            // symbol size
				  src,                // symbol data
				  sizeof(src),        // sizeof symbol data
				  iblock,             // i-block
				  sizeof(iblock))); // size thereof

        /* Compute encoding/decoding */
        memset(enc, 0, sizeof(enc));
        RUN_NOFAIL(RqOutExecute(outProgram,
                                    symSize,
                                    iblock,
                                    enc,
                                    sizeof(enc)));

        /* End of transcode */

        /* Write out data to output file */
        ofs.write ((char*)(&enc[0]), sizeof(enc));
        if (!ofs.good() ) {
            fprintf(stderr,  "Error:%s:%d: Error while writing to output file\n",
                    __FILE__, __LINE__);

            status = 1;
            DONE();
        }
    }

    DONE();
#undef RUN_NOFAIL__INT
#undef RUN_NOFAIL
#undef DONE
}